

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSBuilder::ensureModuleVar(Wasm2JSBuilder *this,Ref ast,Importable *imp)

{
  bool bVar1;
  size_type sVar2;
  Ref r;
  Value *this_00;
  Ref RVar3;
  Ref RVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  Ref in_R8;
  Name name;
  IString name_00;
  IString str;
  IString name_01;
  IString name_02;
  IString IVar5;
  IString name_03;
  Ref local_d0;
  char *local_c8;
  Ref local_38;
  Ref rhs;
  Ref theVar;
  Importable *imp_local;
  Wasm2JSBuilder *this_local;
  Ref ast_local;
  
  this_local = (Wasm2JSBuilder *)ast.inst;
  sVar2 = std::
          unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
          ::count(&this->seenModuleImports,&(imp->module).super_IString);
  if (sVar2 == 0) {
    r = cashew::ValueBuilder::makeVar(false);
    this_00 = cashew::Ref::operator->((Ref *)&this_local);
    rhs.inst = r.inst;
    cashew::Value::push_back(this_00,r);
    cashew::Ref::Ref(&local_38,(Value *)0x0);
    name.super_IString.str._M_str = extraout_RDX;
    name.super_IString.str._M_len = (size_t)(imp->module).super_IString.str._M_str;
    bVar1 = needsQuoting((wasm *)(imp->module).super_IString.str._M_len,name);
    if (bVar1) {
      name_00.str._M_str = extraout_RDX_00;
      name_00.str._M_len = DAT_002efbb0;
      RVar3 = cashew::ValueBuilder::makeName(importObject,name_00);
      str.str._M_str = extraout_RDX_01;
      str.str._M_len = (size_t)(imp->module).super_IString.str._M_str;
      RVar4 = cashew::ValueBuilder::makeString
                        ((ValueBuilder *)(imp->module).super_IString.str._M_len,str);
      local_38 = cashew::ValueBuilder::makeSub(RVar3,RVar4);
    }
    else {
      name_01.str._M_str = extraout_RDX_00;
      name_01.str._M_len = DAT_002efbb0;
      RVar3 = cashew::ValueBuilder::makeName(importObject,name_01);
      name_02.str._M_str = extraout_RDX_02;
      name_02.str._M_len = (size_t)(imp->module).super_IString.str._M_str;
      RVar4 = cashew::ValueBuilder::makeName
                        ((ValueBuilder *)(imp->module).super_IString.str._M_len,name_02);
      local_38 = cashew::ValueBuilder::makeDot(RVar3,RVar4);
    }
    IVar5 = fromName(this,(imp->module).super_IString.str,Top);
    local_d0.inst = (Value *)IVar5.str._M_len;
    local_c8 = IVar5.str._M_str;
    name_03.str._M_str = (char *)local_38.inst;
    name_03.str._M_len = (size_t)local_c8;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)r.inst,local_d0,name_03,in_R8);
    std::
    unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
    ::insert(&this->seenModuleImports,&(imp->module).super_IString);
  }
  return;
}

Assistant:

void Wasm2JSBuilder::ensureModuleVar(Ref ast, const Importable& imp) {
  if (seenModuleImports.count(imp.module) > 0) {
    return;
  }
  Ref theVar = ValueBuilder::makeVar();
  ast->push_back(theVar);
  Ref rhs;
  if (needsQuoting(imp.module)) {
    rhs = ValueBuilder::makeSub(ValueBuilder::makeName(importObject),
                                ValueBuilder::makeString(imp.module));
  } else {
    rhs = ValueBuilder::makeDot(ValueBuilder::makeName(importObject),
                                ValueBuilder::makeName(imp.module));
  }

  ValueBuilder::appendToVar(theVar, fromName(imp.module, NameScope::Top), rhs);
  seenModuleImports.insert(imp.module);
}